

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O3

bool __thiscall
OSSLECDSA::generateKeyPair
          (OSSLECDSA *this,AsymmetricKeyPair **ppKeyPair,AsymmetricParameters *parameters,
          RNG *param_3)

{
  int iVar1;
  EC_KEY *key;
  ByteString *byteString;
  EC_GROUP *group;
  AsymmetricKeyPair *__s;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar2;
  char *format;
  
  if (parameters != (AsymmetricParameters *)0x0 && ppKeyPair != (AsymmetricKeyPair **)0x0) {
    iVar1 = (*(parameters->super_Serialisable)._vptr_Serialisable[3])(parameters,ECParameters::type)
    ;
    if ((char)iVar1 == '\0') {
      format = "Invalid parameters supplied for ECDSA key generation";
      iVar1 = 0x11a;
    }
    else {
      key = EC_KEY_new();
      if (key != (EC_KEY *)0x0) {
        byteString = ECParameters::getEC((ECParameters *)parameters);
        group = OSSL::byteString2grp(byteString);
        EC_KEY_set_group(key,(EC_GROUP *)group);
        EC_GROUP_free((EC_GROUP *)group);
        iVar1 = EC_KEY_generate_key(key);
        if (iVar1 == 0) {
          uVar2 = ERR_get_error();
          softHSMLog(3,"generateKeyPair",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                     ,0x130,"ECDSA key generation failed (0x%08X)",uVar2);
          EC_KEY_free(key);
          return false;
        }
        __s = (AsymmetricKeyPair *)operator_new(200);
        memset(__s,0,200);
        (__s->super_Serialisable)._vptr_Serialisable = (_func_int **)&PTR_serialise_0019c910;
        OSSLECPublicKey::OSSLECPublicKey((OSSLECPublicKey *)(__s + 1));
        OSSLECPrivateKey::OSSLECPrivateKey((OSSLECPrivateKey *)(__s + 0xd));
        iVar1 = (*(__s->super_Serialisable)._vptr_Serialisable[3])(__s);
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x60))
                  ((long *)CONCAT44(extraout_var,iVar1),key);
        iVar1 = (*(__s->super_Serialisable)._vptr_Serialisable[5])(__s);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))
                  ((long *)CONCAT44(extraout_var_00,iVar1),key);
        *ppKeyPair = __s;
        EC_KEY_free(key);
        return true;
      }
      format = "Failed to instantiate OpenSSL ECDSA object";
      iVar1 = 0x125;
    }
    softHSMLog(3,"generateKeyPair",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
               ,iVar1,format);
  }
  return false;
}

Assistant:

bool OSSLECDSA::generateKeyPair(AsymmetricKeyPair** ppKeyPair, AsymmetricParameters* parameters, RNG* /*rng = NULL */)
{
	// Check parameters
	if ((ppKeyPair == NULL) ||
	    (parameters == NULL))
	{
		return false;
	}

	if (!parameters->areOfType(ECParameters::type))
	{
		ERROR_MSG("Invalid parameters supplied for ECDSA key generation");

		return false;
	}

	ECParameters* params = (ECParameters*) parameters;

	// Generate the key-pair
	EC_KEY* eckey = EC_KEY_new();
	if (eckey == NULL)
	{
		ERROR_MSG("Failed to instantiate OpenSSL ECDSA object");

		return false;
	}

	EC_GROUP* grp = OSSL::byteString2grp(params->getEC());
	EC_KEY_set_group(eckey, grp);
	EC_GROUP_free(grp);

	if (!EC_KEY_generate_key(eckey))
	{
		ERROR_MSG("ECDSA key generation failed (0x%08X)", ERR_get_error());

		EC_KEY_free(eckey);

		return false;
	}

	// Create an asymmetric key-pair object to return
	OSSLECKeyPair* kp = new OSSLECKeyPair();

	((OSSLECPublicKey*) kp->getPublicKey())->setFromOSSL(eckey);
	((OSSLECPrivateKey*) kp->getPrivateKey())->setFromOSSL(eckey);

	*ppKeyPair = kp;

	// Release the key
	EC_KEY_free(eckey);

	return true;
}